

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O2

void __thiscall
draco::OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
          (OctahedronToolBox *this,float *vector,int32_t *out_s,int32_t *out_t)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined8 local_58;
  int local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  dVar8 = (double)(float)*(undefined8 *)vector;
  dVar9 = (double)(float)((ulong)*(undefined8 *)vector >> 0x20);
  auVar1._8_4_ = SUB84(dVar9,0);
  auVar1._0_8_ = dVar8;
  auVar1._12_4_ = (int)((ulong)dVar9 >> 0x20);
  dVar5 = (double)((ulong)DAT_00191ad0 & (ulong)(double)vector[2]) +
          SUB168(auVar1 & _DAT_00191ad0,8) + SUB168(auVar1 & _DAT_00191ad0,0);
  if (dVar5 <= 1e-06) {
    dVar8 = 1.0;
    dVar9 = 0.0;
    bVar2 = false;
  }
  else {
    dVar5 = 1.0 / dVar5;
    dVar8 = dVar5 * dVar8;
    dVar9 = dVar5 * dVar9;
    bVar2 = dVar5 * (double)vector[2] < 0.0;
  }
  iVar3 = this->center_value_;
  dVar5 = (double)iVar3;
  local_48 = dVar5 * dVar8 + 0.5;
  dStack_40 = dVar5 * dVar9 + 0.5;
  local_38 = floor(local_48);
  dVar8 = floor(dStack_40);
  iVar4 = (int)local_38;
  iVar6 = (int)dVar8;
  local_58 = CONCAT44(iVar6,iVar4);
  uVar7 = local_58 ^ CONCAT44(iVar6 >> 0x1f,iVar4 >> 0x1f);
  local_50 = iVar3 - (((int)(uVar7 >> 0x20) - (iVar6 >> 0x1f)) + ((int)uVar7 - (iVar4 >> 0x1f)));
  if (local_50 < 0) {
    iVar3 = -local_50;
    if (0 < iVar6) {
      iVar3 = local_50;
    }
    local_58 = CONCAT44(iVar3 + iVar6,iVar4);
    local_50 = 0;
  }
  if (bVar2) {
    local_50 = -local_50;
  }
  IntegerVectorToQuantizedOctahedralCoords(this,(int32_t *)&local_58,out_s,out_t);
  return;
}

Assistant:

void FloatVectorToQuantizedOctahedralCoords(const T *vector, int32_t *out_s,
                                              int32_t *out_t) const {
    const double abs_sum = std::abs(static_cast<double>(vector[0])) +
                           std::abs(static_cast<double>(vector[1])) +
                           std::abs(static_cast<double>(vector[2]));

    // Adjust values such that abs sum equals 1.
    double scaled_vector[3];
    if (abs_sum > 1e-6) {
      // Scale needed to project the vector to the surface of an octahedron.
      const double scale = 1.0 / abs_sum;
      scaled_vector[0] = vector[0] * scale;
      scaled_vector[1] = vector[1] * scale;
      scaled_vector[2] = vector[2] * scale;
    } else {
      scaled_vector[0] = 1.0;
      scaled_vector[1] = 0;
      scaled_vector[2] = 0;
    }

    // Scale vector such that the sum equals the center value.
    int32_t int_vec[3];
    int_vec[0] =
        static_cast<int32_t>(floor(scaled_vector[0] * center_value_ + 0.5));
    int_vec[1] =
        static_cast<int32_t>(floor(scaled_vector[1] * center_value_ + 0.5));
    // Make sure the sum is exactly the center value.
    int_vec[2] = center_value_ - std::abs(int_vec[0]) - std::abs(int_vec[1]);
    if (int_vec[2] < 0) {
      // If the sum of first two coordinates is too large, we need to decrease
      // the length of one of the coordinates.
      if (int_vec[1] > 0) {
        int_vec[1] += int_vec[2];
      } else {
        int_vec[1] -= int_vec[2];
      }
      int_vec[2] = 0;
    }
    // Take care of the sign.
    if (scaled_vector[2] < 0) {
      int_vec[2] *= -1;
    }

    IntegerVectorToQuantizedOctahedralCoords(int_vec, out_s, out_t);
  }